

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::TypeParameterizedTestSuiteRegistry::CheckForInstantiations
          (TypeParameterizedTestSuiteRegistry *this)

{
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
  *__k;
  _Rb_tree_color _Var1;
  char *__s;
  _Alloc_hider name;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  const_iterator cVar2;
  TestFactoryBase *factory;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr p_Var5;
  allocator<char> local_1d2;
  allocator<char> local_1d1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d0;
  size_type local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1b0;
  _Base_ptr local_1a8;
  _Rb_tree_node_base *local_1a0;
  CodeLocation local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string full_name;
  string message;
  anon_class_112_2_99c2db9c_for_factory_ local_110;
  anon_class_112_2_99c2db9c_for_factory_ local_a0;
  
  this_00 = &GetIgnoredParameterizedTestSuites_abi_cxx11_()->_M_t;
  p_Var4 = &(this->suites_)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var5 = &(((_Rep_type *)&this_00->_M_impl)->_M_impl).super__Rb_tree_header._M_header;
  local_1b0 = this_00;
  local_1a8 = p_Var5;
  local_1a0 = p_Var4;
  for (p_Var3 = (this->suites_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var3 != p_Var4; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    if (*(char *)&p_Var3[3]._M_parent == '\0') {
      __k = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
             *)(p_Var3 + 1);
      cVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(this_00,(key_type *)__k);
      if (cVar2._M_node == p_Var5) {
        std::operator+(&local_170,"Type parameterized test suite ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
        std::operator+(&local_198.file,&local_170,
                       " is defined via REGISTER_TYPED_TEST_SUITE_P, but never instantiated via INSTANTIATE_TYPED_TEST_SUITE_P. None of the test cases will run.\n\nIdeally, TYPED_TEST_P definitions should only ever be included as part of binaries that intend to use them. (As opposed to, for example, being placed in a library that may be linked in to get other utilities.)\n\nTo suppress this error for this test suite, insert the following line (in a non-header) in the namespace it is defined in:\n\nGTEST_ALLOW_UNINSTANTIATED_PARAMETERIZED_TEST("
                      );
        std::operator+(&local_a0.message,&local_198.file,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
        std::operator+(&message,&local_a0.message,");");
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&local_170);
        std::operator+(&local_a0.message,"UninstantiatedTypeParameterizedTestSuite<",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
        std::operator+(&full_name,&local_a0.message,">");
        std::__cxx11::string::~string((string *)&local_a0);
        name = full_name._M_dataplus;
        __s = *(char **)(p_Var3 + 2);
        _Var1 = p_Var3[3]._M_color;
        std::__cxx11::string::string((string *)&local_110,&message);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
        ::pair(&local_110.testcase,__k);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_170,"GoogleTestVerification",&local_1d1);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,__s,&local_1d2);
        local_198.file._M_string_length = local_1c8;
        local_198.file._M_dataplus._M_p = (pointer)&local_198.file.field_2;
        if (local_1d0 == &local_1c0) {
          local_198.file.field_2._8_8_ = local_1c0._8_8_;
        }
        else {
          local_198.file._M_dataplus._M_p = (pointer)local_1d0;
        }
        local_198.file.field_2._M_allocated_capacity._1_7_ = local_1c0._M_allocated_capacity._1_7_;
        local_198.file.field_2._M_local_buf[0] = local_1c0._M_local_buf[0];
        local_1c8 = 0;
        local_1c0._M_local_buf[0] = '\0';
        local_1d0 = &local_1c0;
        local_198.line = _Var1;
        factory = (TestFactoryBase *)operator_new(0x78);
        CheckForInstantiations()::$_0::__0((__0 *)&local_a0,&local_110);
        factory->_vptr_TestFactoryBase =
             (_func_int **)
             (
             _ZTVZN7testing12RegisterTestITpTnRiJEZNS_8internal34TypeParameterizedTestSuiteRegistry22CheckForInstantiationsEvE3__0EEPNS_8TestInfoEPKcS8_S8_S8_S8_iT0_E11FactoryImpl
             + 0x10);
        CheckForInstantiations()::$_0::__0((__0 *)(factory + 1),&local_a0);
        MakeAndRegisterTestInfo
                  (&local_170,name._M_p,(char *)0x0,(char *)0x0,&local_198,
                   &TypeIdHelper<testing::internal::(anonymous_namespace)::FailureTest>::dummy_,
                   (SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,factory);
        CheckForInstantiations()::$_0::~__0((__0 *)&local_a0);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_170);
        CheckForInstantiations()::$_0::~__0((__0 *)&local_110);
        std::__cxx11::string::~string((string *)&full_name);
        std::__cxx11::string::~string((string *)&message);
        p_Var4 = local_1a0;
        this_00 = local_1b0;
        p_Var5 = local_1a8;
      }
    }
  }
  return;
}

Assistant:

void TypeParameterizedTestSuiteRegistry::CheckForInstantiations() {
  const auto& ignored = *GetIgnoredParameterizedTestSuites();
  for (const auto& testcase : suites_) {
    if (testcase.second.instantiated) continue;
    if (ignored.find(testcase.first) != ignored.end()) continue;

    std::string message =
        "Type parameterized test suite " + testcase.first +
        " is defined via REGISTER_TYPED_TEST_SUITE_P, but never instantiated "
        "via INSTANTIATE_TYPED_TEST_SUITE_P. None of the test cases will run."
        "\n\n"
        "Ideally, TYPED_TEST_P definitions should only ever be included as "
        "part of binaries that intend to use them. (As opposed to, for "
        "example, being placed in a library that may be linked in to get "
        "other "
        "utilities.)"
        "\n\n"
        "To suppress this error for this test suite, insert the following "
        "line "
        "(in a non-header) in the namespace it is defined in:"
        "\n\n"
        "GTEST_ALLOW_UNINSTANTIATED_PARAMETERIZED_TEST(" +
        testcase.first + ");";

    std::string full_name =
        "UninstantiatedTypeParameterizedTestSuite<" + testcase.first + ">";
    RegisterTest(  //
        "GoogleTestVerification", full_name.c_str(),
        nullptr,  // No type parameter.
        nullptr,  // No value parameter.
        testcase.second.code_location.file.c_str(),
        testcase.second.code_location.line, [message, testcase] {
          return new FailureTest(testcase.second.code_location, message,
                                 kErrorOnUninstantiatedTypeParameterizedTest);
        });
  }
}